

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_inherit_streams(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  size_t __n;
  ssize_t sVar4;
  int *piVar5;
  size_t extraout_RAX;
  anon_union_8_2_26168aa3_for_data unaff_R14;
  char cVar6;
  undefined1 *unaff_R15;
  long lVar7;
  undefined1 *__buf;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int fds_stdout [2];
  int fds_stdin [2];
  uv_stdio_container_t child_stdio [2];
  uv_pipe_t pipe_stdout_parent;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_child;
  uchar ubuf [1023];
  uv_process_t child_req;
  uv_write_t write_req;
  undefined1 auStack_de0 [1024];
  undefined8 uStack_9e0;
  anon_union_8_2_26168aa3_for_data aStack_9d8;
  code *pcStack_9d0;
  undefined4 local_9c8;
  undefined4 local_9c4;
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined1 local_9b8 [16];
  uv_stdio_container_t local_9a8;
  undefined4 local_998;
  undefined1 *local_990;
  undefined1 local_988 [264];
  undefined1 local_880 [264];
  undefined1 local_778 [264];
  undefined1 local_670 [264];
  char local_568 [1160];
  undefined1 local_e0 [192];
  long lVar9;
  
  pcStack_9d0 = (code *)0x17bec7;
  init_process_options("spawn_helper9",exit_cb);
  pcStack_9d0 = (code *)0x17becc;
  uVar3 = uv_default_loop();
  pcStack_9d0 = (code *)0x17bee1;
  iVar1 = uv_pipe_init(uVar3,local_670,0);
  if (iVar1 == 0) {
    pcStack_9d0 = (code *)0x17befb;
    iVar1 = uv_pipe_init(uVar3,local_778,0);
    if (iVar1 != 0) goto LAB_0017c63d;
    pcStack_9d0 = (code *)0x17bf15;
    iVar1 = uv_pipe_init(uVar3,local_880,0);
    if (iVar1 != 0) goto LAB_0017c642;
    pcStack_9d0 = (code *)0x17bf2c;
    iVar1 = uv_pipe_init(uVar3,local_988,0);
    if (iVar1 != 0) goto LAB_0017c647;
    pcStack_9d0 = (code *)0x17bf42;
    iVar1 = uv_pipe(&local_9c0,0,0);
    if (iVar1 != 0) goto LAB_0017c64c;
    pcStack_9d0 = (code *)0x17bf56;
    iVar1 = uv_pipe(&local_9c8,0,0);
    if (iVar1 != 0) goto LAB_0017c651;
    pcStack_9d0 = (code *)0x17bf6f;
    iVar1 = uv_pipe_open(local_670,local_9c0);
    if (iVar1 != 0) goto LAB_0017c656;
    pcStack_9d0 = (code *)0x17bf88;
    iVar1 = uv_pipe_open(local_778,local_9c4);
    if (iVar1 != 0) goto LAB_0017c65b;
    pcStack_9d0 = (code *)0x17bfa1;
    iVar1 = uv_pipe_open(local_880,local_9bc);
    if (iVar1 != 0) goto LAB_0017c660;
    pcStack_9d0 = (code *)0x17bfb6;
    iVar1 = uv_pipe_open(local_988,local_9c8);
    if (iVar1 != 0) goto LAB_0017c665;
    pcStack_9d0 = (code *)0x17bfcb;
    iVar1 = uv_is_readable();
    if (iVar1 == 0) goto LAB_0017c66a;
    pcStack_9d0 = (code *)0x17bfe0;
    iVar1 = uv_is_writable();
    if (iVar1 == 0) goto LAB_0017c66f;
    pcStack_9d0 = (code *)0x17bff5;
    iVar1 = uv_is_writable();
    if (iVar1 == 0) goto LAB_0017c674;
    pcStack_9d0 = (code *)0x17c007;
    iVar1 = uv_is_readable();
    if (iVar1 == 0) goto LAB_0017c679;
    unaff_R14.stream = (uv_stream_t *)local_670;
    pcStack_9d0 = (code *)0x17c01f;
    iVar1 = uv_is_writable(unaff_R14.stream);
    unaff_R15 = local_778;
    pcStack_9d0 = (code *)0x17c031;
    iVar2 = uv_is_readable();
    if (iVar2 != iVar1) goto LAB_0017c67e;
    pcStack_9d0 = (code *)0x17c046;
    iVar2 = uv_is_readable();
    if (iVar2 != iVar1) goto LAB_0017c683;
    pcStack_9d0 = (code *)0x17c058;
    iVar2 = uv_is_writable();
    if (iVar2 != iVar1) goto LAB_0017c688;
    options.stdio = &local_9a8;
    local_9a8.flags = UV_INHERIT_STREAM;
    local_998 = 4;
    options.stdio_count = 2;
    pcStack_9d0 = (code *)0x17c09f;
    local_9a8.data.stream = unaff_R14.stream;
    local_990 = unaff_R15;
    iVar1 = uv_spawn(uVar3,local_568 + 0x400,&options);
    if (iVar1 != 0) goto LAB_0017c68d;
    unaff_R14.stream = (uv_stream_t *)local_568;
    lVar7 = 0;
    pcStack_9d0 = (code *)0x17c0c1;
    uv_close(local_670,0);
    pcStack_9d0 = (code *)0x17c0d0;
    uv_close(local_778,0);
    pcStack_9d0 = (code *)0x17c0e2;
    local_9b8 = uv_buf_init(local_568);
    auVar8 = _DAT_0019f170;
    auVar10 = _DAT_0019f180;
    auVar11 = _DAT_0019f190;
    auVar12 = _DAT_0019f1a0;
    auVar13 = _DAT_0019f1b0;
    auVar14 = _DAT_0019f1c0;
    auVar15 = _DAT_0019f1d0;
    auVar16 = _DAT_0019f1e0;
    do {
      auVar17 = auVar16 ^ _DAT_0019f200;
      iVar1 = auVar17._0_4_;
      iVar2 = auVar17._8_4_;
      auVar26._4_4_ = iVar1;
      auVar26._0_4_ = iVar1;
      auVar26._8_4_ = iVar2;
      auVar26._12_4_ = iVar2;
      auVar34._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar34._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar34._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar34._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar18._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
      auVar18._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
      auVar18._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
      auVar18._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
      auVar18 = auVar18 & auVar34;
      auVar17 = pshuflw(auVar26,auVar18,0xe8);
      auVar17 = packssdw(auVar17,auVar17);
      cVar6 = (char)lVar7;
      if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_568[lVar7] = cVar6;
      }
      auVar17 = packssdw(auVar18,auVar18);
      auVar17 = packssdw(auVar17,auVar17);
      auVar17 = packsswb(auVar17,auVar17);
      if ((auVar17._0_4_ >> 8 & 1) != 0) {
        local_568[lVar7 + 1] = cVar6 + '\x01';
      }
      auVar17 = auVar15 ^ _DAT_0019f200;
      iVar1 = auVar17._0_4_;
      iVar2 = auVar17._8_4_;
      auVar27._4_4_ = iVar1;
      auVar27._0_4_ = iVar1;
      auVar27._8_4_ = iVar2;
      auVar27._12_4_ = iVar2;
      auVar35._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar35._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar35._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar35._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar19._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
      auVar19._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
      auVar19._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
      auVar19._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
      auVar19 = auVar19 & auVar35;
      auVar17 = packssdw(auVar27,auVar19);
      auVar17 = packssdw(auVar17,auVar17);
      auVar17 = packsswb(auVar17,auVar17);
      if ((auVar17._0_4_ >> 0x10 & 1) != 0) {
        local_568[lVar7 + 2] = cVar6 + '\x02';
      }
      auVar17 = pshufhw(auVar19,auVar19,0x84);
      auVar17 = packssdw(auVar17,auVar17);
      auVar17 = packsswb(auVar17,auVar17);
      if ((auVar17._0_4_ >> 0x18 & 1) != 0) {
        local_568[lVar7 + 3] = cVar6 + '\x03';
      }
      auVar17 = auVar14 ^ _DAT_0019f200;
      iVar1 = auVar17._0_4_;
      iVar2 = auVar17._8_4_;
      auVar28._4_4_ = iVar1;
      auVar28._0_4_ = iVar1;
      auVar28._8_4_ = iVar2;
      auVar28._12_4_ = iVar2;
      auVar36._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar36._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar36._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar36._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar20._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
      auVar20._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
      auVar20._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
      auVar20._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
      auVar20 = auVar20 & auVar36;
      auVar17 = pshuflw(auVar28,auVar20,0xe8);
      auVar17 = packssdw(auVar17,auVar17);
      auVar17 = packsswb(auVar17,auVar17);
      if ((auVar17 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_568[lVar7 + 4] = cVar6 + '\x04';
      }
      auVar17 = packssdw(auVar20,auVar20);
      auVar17 = packssdw(auVar17,auVar17);
      auVar17 = packsswb(auVar17,auVar17);
      if ((auVar17._4_2_ >> 8 & 1) != 0) {
        local_568[lVar7 + 5] = cVar6 + '\x05';
      }
      auVar17 = auVar13 ^ _DAT_0019f200;
      iVar1 = auVar17._0_4_;
      iVar2 = auVar17._8_4_;
      auVar29._4_4_ = iVar1;
      auVar29._0_4_ = iVar1;
      auVar29._8_4_ = iVar2;
      auVar29._12_4_ = iVar2;
      auVar37._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar37._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar37._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar37._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar21._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
      auVar21._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
      auVar21._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
      auVar21._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
      auVar21 = auVar21 & auVar37;
      auVar17 = packssdw(auVar29,auVar21);
      auVar17 = packssdw(auVar17,auVar17);
      auVar17 = packsswb(auVar17,auVar17);
      if ((auVar17 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_568[lVar7 + 6] = cVar6 + '\x06';
      }
      auVar17 = pshufhw(auVar21,auVar21,0x84);
      auVar17 = packssdw(auVar17,auVar17);
      auVar17 = packsswb(auVar17,auVar17);
      if ((auVar17._6_2_ >> 8 & 1) != 0) {
        local_568[lVar7 + 7] = cVar6 + '\a';
      }
      auVar17 = auVar12 ^ _DAT_0019f200;
      iVar1 = auVar17._0_4_;
      iVar2 = auVar17._8_4_;
      auVar30._4_4_ = iVar1;
      auVar30._0_4_ = iVar1;
      auVar30._8_4_ = iVar2;
      auVar30._12_4_ = iVar2;
      auVar38._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar38._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar38._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar38._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar22._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
      auVar22._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
      auVar22._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
      auVar22._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
      auVar22 = auVar22 & auVar38;
      auVar17 = pshuflw(auVar30,auVar22,0xe8);
      auVar17 = packssdw(auVar17,auVar17);
      auVar17 = packsswb(auVar17,auVar17);
      if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_568[lVar7 + 8] = cVar6 + '\b';
      }
      auVar17 = packssdw(auVar22,auVar22);
      auVar17 = packssdw(auVar17,auVar17);
      auVar17 = packsswb(auVar17,auVar17);
      if ((auVar17._8_2_ >> 8 & 1) != 0) {
        local_568[lVar7 + 9] = cVar6 + '\t';
      }
      auVar17 = auVar11 ^ _DAT_0019f200;
      iVar1 = auVar17._0_4_;
      iVar2 = auVar17._8_4_;
      auVar31._4_4_ = iVar1;
      auVar31._0_4_ = iVar1;
      auVar31._8_4_ = iVar2;
      auVar31._12_4_ = iVar2;
      auVar39._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar39._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar39._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar39._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar23._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
      auVar23._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
      auVar23._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
      auVar23._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
      auVar23 = auVar23 & auVar39;
      auVar17 = packssdw(auVar31,auVar23);
      auVar17 = packssdw(auVar17,auVar17);
      auVar17 = packsswb(auVar17,auVar17);
      if ((auVar17 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        local_568[lVar7 + 10] = cVar6 + '\n';
      }
      auVar17 = pshufhw(auVar23,auVar23,0x84);
      auVar17 = packssdw(auVar17,auVar17);
      auVar17 = packsswb(auVar17,auVar17);
      if ((auVar17._10_2_ >> 8 & 1) != 0) {
        local_568[lVar7 + 0xb] = cVar6 + '\v';
      }
      auVar17 = auVar10 ^ _DAT_0019f200;
      iVar1 = auVar17._0_4_;
      iVar2 = auVar17._8_4_;
      auVar32._4_4_ = iVar1;
      auVar32._0_4_ = iVar1;
      auVar32._8_4_ = iVar2;
      auVar32._12_4_ = iVar2;
      auVar40._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar40._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar40._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar40._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar24._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
      auVar24._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
      auVar24._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
      auVar24._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
      auVar24 = auVar24 & auVar40;
      auVar17 = pshuflw(auVar32,auVar24,0xe8);
      auVar17 = packssdw(auVar17,auVar17);
      auVar17 = packsswb(auVar17,auVar17);
      if ((auVar17 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_568[lVar7 + 0xc] = cVar6 + '\f';
      }
      auVar17 = packssdw(auVar24,auVar24);
      auVar17 = packssdw(auVar17,auVar17);
      auVar17 = packsswb(auVar17,auVar17);
      if ((auVar17._12_2_ >> 8 & 1) != 0) {
        local_568[lVar7 + 0xd] = cVar6 + '\r';
      }
      auVar17 = auVar8 ^ _DAT_0019f200;
      iVar1 = auVar17._0_4_;
      iVar2 = auVar17._8_4_;
      auVar33._4_4_ = iVar1;
      auVar33._0_4_ = iVar1;
      auVar33._8_4_ = iVar2;
      auVar33._12_4_ = iVar2;
      auVar41._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar41._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar41._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar41._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar25._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
      auVar25._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
      auVar25._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
      auVar25._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
      auVar25 = auVar25 & auVar41;
      auVar17 = packssdw(auVar33,auVar25);
      auVar17 = packssdw(auVar17,auVar17);
      auVar17 = packsswb(auVar17,auVar17);
      if ((auVar17 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_568[lVar7 + 0xe] = cVar6 + '\x0e';
      }
      auVar17 = pshufhw(auVar25,auVar25,0x84);
      auVar17 = packssdw(auVar17,auVar17);
      auVar17 = packsswb(auVar17,auVar17);
      if ((auVar17._14_2_ >> 8 & 1) != 0) {
        local_568[lVar7 + 0xf] = cVar6 + '\x0f';
      }
      lVar7 = lVar7 + 0x10;
      lVar9 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 0x10;
      auVar16._8_8_ = lVar9 + 0x10;
      lVar9 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 0x10;
      auVar15._8_8_ = lVar9 + 0x10;
      lVar9 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 0x10;
      auVar14._8_8_ = lVar9 + 0x10;
      lVar9 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 0x10;
      auVar13._8_8_ = lVar9 + 0x10;
      lVar9 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 0x10;
      auVar12._8_8_ = lVar9 + 0x10;
      lVar9 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 0x10;
      auVar11._8_8_ = lVar9 + 0x10;
      lVar9 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 0x10;
      auVar10._8_8_ = lVar9 + 0x10;
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 0x10;
      auVar8._8_8_ = lVar9 + 0x10;
    } while (lVar7 != 0x400);
    pcStack_9d0 = (code *)0x17c555;
    memset(output,0,0x3ff);
    pcStack_9d0 = (code *)0x17c57b;
    iVar1 = uv_write(local_e0,local_880,local_9b8,1,write_cb);
    unaff_R15 = (undefined1 *)0x400;
    if (iVar1 != 0) goto LAB_0017c692;
    pcStack_9d0 = (code *)0x17c59b;
    iVar1 = uv_read_start(local_988,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_0017c697;
    pcStack_9d0 = (code *)0x17c5ad;
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_0017c69c;
    if (exit_cb_called != 1) goto LAB_0017c6a1;
    if (close_cb_called != 3) goto LAB_0017c6a6;
    pcStack_9d0 = (code *)0x17c5e3;
    iVar1 = bcmp(unaff_R14.stream,output,0x3ff);
    if (iVar1 == 0) {
      pcStack_9d0 = (code *)0x17c5f0;
      uVar3 = uv_default_loop();
      pcStack_9d0 = (code *)0x17c604;
      uv_walk(uVar3,close_walk_cb,0);
      pcStack_9d0 = (code *)0x17c60e;
      uv_run(uVar3,0);
      pcStack_9d0 = (code *)0x17c613;
      uv_default_loop();
      pcStack_9d0 = (code *)0x17c61b;
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        pcStack_9d0 = (code *)0x17c628;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0017c6b0;
    }
  }
  else {
    pcStack_9d0 = (code *)0x17c63d;
    run_test_spawn_inherit_streams_cold_1();
LAB_0017c63d:
    pcStack_9d0 = (code *)0x17c642;
    run_test_spawn_inherit_streams_cold_2();
LAB_0017c642:
    pcStack_9d0 = (code *)0x17c647;
    run_test_spawn_inherit_streams_cold_3();
LAB_0017c647:
    pcStack_9d0 = (code *)0x17c64c;
    run_test_spawn_inherit_streams_cold_4();
LAB_0017c64c:
    pcStack_9d0 = (code *)0x17c651;
    run_test_spawn_inherit_streams_cold_5();
LAB_0017c651:
    pcStack_9d0 = (code *)0x17c656;
    run_test_spawn_inherit_streams_cold_6();
LAB_0017c656:
    pcStack_9d0 = (code *)0x17c65b;
    run_test_spawn_inherit_streams_cold_7();
LAB_0017c65b:
    pcStack_9d0 = (code *)0x17c660;
    run_test_spawn_inherit_streams_cold_8();
LAB_0017c660:
    pcStack_9d0 = (code *)0x17c665;
    run_test_spawn_inherit_streams_cold_9();
LAB_0017c665:
    pcStack_9d0 = (code *)0x17c66a;
    run_test_spawn_inherit_streams_cold_10();
LAB_0017c66a:
    pcStack_9d0 = (code *)0x17c66f;
    run_test_spawn_inherit_streams_cold_25();
LAB_0017c66f:
    pcStack_9d0 = (code *)0x17c674;
    run_test_spawn_inherit_streams_cold_24();
LAB_0017c674:
    pcStack_9d0 = (code *)0x17c679;
    run_test_spawn_inherit_streams_cold_23();
LAB_0017c679:
    pcStack_9d0 = (code *)0x17c67e;
    run_test_spawn_inherit_streams_cold_22();
LAB_0017c67e:
    pcStack_9d0 = (code *)0x17c683;
    run_test_spawn_inherit_streams_cold_11();
LAB_0017c683:
    pcStack_9d0 = (code *)0x17c688;
    run_test_spawn_inherit_streams_cold_12();
LAB_0017c688:
    pcStack_9d0 = (code *)0x17c68d;
    run_test_spawn_inherit_streams_cold_13();
LAB_0017c68d:
    pcStack_9d0 = (code *)0x17c692;
    run_test_spawn_inherit_streams_cold_14();
LAB_0017c692:
    pcStack_9d0 = (code *)0x17c697;
    run_test_spawn_inherit_streams_cold_15();
LAB_0017c697:
    pcStack_9d0 = (code *)0x17c69c;
    run_test_spawn_inherit_streams_cold_16();
LAB_0017c69c:
    pcStack_9d0 = (code *)0x17c6a1;
    run_test_spawn_inherit_streams_cold_17();
LAB_0017c6a1:
    pcStack_9d0 = (code *)0x17c6a6;
    run_test_spawn_inherit_streams_cold_18();
LAB_0017c6a6:
    pcStack_9d0 = (code *)0x17c6ab;
    run_test_spawn_inherit_streams_cold_19();
  }
  pcStack_9d0 = (code *)0x17c6b0;
  run_test_spawn_inherit_streams_cold_20();
LAB_0017c6b0:
  pcStack_9d0 = spawn_stdin_stdout;
  run_test_spawn_inherit_streams_cold_21();
  uStack_9e0 = uVar3;
  aStack_9d8 = unaff_R14;
  pcStack_9d0 = (code *)unaff_R15;
  do {
    while( true ) {
      __n = read(0,auStack_de0,0x400);
      if (__n == 0xffffffffffffffff) break;
      if (__n == 0) goto LAB_0017c726;
      __buf = auStack_de0;
      if ((long)__n < 1) goto LAB_0017c721;
      do {
        while( true ) {
          uVar3 = 1;
          sVar4 = write(1,__buf,__n);
          if (sVar4 != -1) break;
          piVar5 = __errno_location();
          if (*piVar5 != 4) {
LAB_0017c733:
            spawn_stdin_stdout_cold_2();
            iVar1 = uv_is_closing();
            if (iVar1 == 0) {
              iVar1 = uv_close(uVar3,0);
              return iVar1;
            }
            return iVar1;
          }
        }
        if (sVar4 < 0) goto LAB_0017c733;
        __n = __n - sVar4;
        __buf = __buf + sVar4;
      } while (__n != 0);
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
LAB_0017c721:
  spawn_stdin_stdout_cold_1();
  __n = extraout_RAX;
LAB_0017c726:
  return (int)__n;
}

Assistant:

TEST_IMPL(spawn_inherit_streams) {
  uv_process_t child_req;
  uv_stdio_container_t child_stdio[2];
  int fds_stdin[2];
  int fds_stdout[2];
  uv_pipe_t pipe_stdin_child;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_parent;
  unsigned char ubuf[OUTPUT_SIZE - 1];
  uv_buf_t buf;
  unsigned int i;
  int r;
  int bidir;
  uv_write_t write_req;
  uv_loop_t* loop;

  init_process_options("spawn_helper9", exit_cb);

  loop = uv_default_loop();
  ASSERT(uv_pipe_init(loop, &pipe_stdin_child, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdout_child, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdin_parent, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdout_parent, 0) == 0);

  ASSERT(uv_pipe(fds_stdin, 0, 0) == 0);
  ASSERT(uv_pipe(fds_stdout, 0, 0) == 0);

  ASSERT(uv_pipe_open(&pipe_stdin_child, fds_stdin[0]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdout_child, fds_stdout[1]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdin_parent, fds_stdin[1]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdout_parent, fds_stdout[0]) == 0);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdin_parent));
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_parent));
  /* Some systems (SVR4) open a bidirectional pipe, most don't. */
  bidir = uv_is_writable((uv_stream_t*) &pipe_stdin_child);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_child) == bidir);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_parent) == bidir);
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_parent) == bidir);

  child_stdio[0].flags = UV_INHERIT_STREAM;
  child_stdio[0].data.stream = (uv_stream_t *) &pipe_stdin_child;

  child_stdio[1].flags = UV_INHERIT_STREAM;
  child_stdio[1].data.stream = (uv_stream_t *) &pipe_stdout_child;

  options.stdio = child_stdio;
  options.stdio_count = 2;

  ASSERT(uv_spawn(loop, &child_req, &options) == 0);

  uv_close((uv_handle_t*) &pipe_stdin_child, NULL);
  uv_close((uv_handle_t*) &pipe_stdout_child, NULL);

  buf = uv_buf_init((char*) ubuf, sizeof ubuf);
  for (i = 0; i < sizeof ubuf; ++i)
    ubuf[i] = i & 255u;
  memset(output, 0, sizeof ubuf);

  r = uv_write(&write_req,
               (uv_stream_t*) &pipe_stdin_parent,
               &buf,
               1,
               write_cb);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) &pipe_stdout_parent, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 3);

  r = memcmp(ubuf, output, sizeof ubuf);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}